

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O2

void HBLAS2::hblas2_ger_square<std::complex<double>,false>(void)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  quaternion<double> *x;
  pointer pqVar4;
  pointer pqVar5;
  long lVar6;
  quaternion<double> *in_XMM0_Qa;
  result_type_conflict1 rVar7;
  result_type_conflict1 rVar8;
  undefined1 auVar9 [16];
  result_type_conflict1 in_XMM1_Qa;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  complex<double> ALPHA_00;
  long lVar13;
  int32_t LDA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  undefined1 local_2f8 [8];
  undefined8 local_2f0;
  shared_count sStack_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  complex<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> AC;
  undefined **local_278;
  undefined1 local_270;
  undefined8 *local_268;
  char **local_260;
  quaternion<double> local_258;
  quaternion<double> __r;
  quaternion<double> local_218;
  quaternion<double> local_1f8;
  quaternion<double> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&X,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&Y,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&ss);
  for (pqVar5 = X.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pqVar4 = Y.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pqVar5 != X.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar5 = pqVar5 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = (quaternion<double> *)std::uniform_real_distribution<double>::operator()(&dis,&gen)
    ;
    pqVar5->_M_real = in_XMM1_Qa;
    pqVar5->_M_imag_i = rVar7;
    pqVar5->_M_imag_j = rVar8;
    pqVar5->_M_imag_k = (double)in_XMM0_Qa;
  }
  for (; pqVar5 = A.
                  super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      pqVar4 != Y.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar4 = pqVar4 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = (quaternion<double> *)std::uniform_real_distribution<double>::operator()(&dis,&gen)
    ;
    pqVar4->_M_real = in_XMM1_Qa;
    pqVar4->_M_imag_i = rVar7;
    pqVar4->_M_imag_j = rVar8;
    pqVar4->_M_imag_k = (double)in_XMM0_Qa;
  }
  for (; pqVar5 != A.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pqVar5 = pqVar5 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_XMM0_Qa = (quaternion<double> *)std::uniform_real_distribution<double>::operator()(&dis,&gen)
    ;
    pqVar5->_M_real = in_XMM1_Qa;
    pqVar5->_M_imag_i = rVar7;
    pqVar5->_M_imag_j = rVar8;
    pqVar5->_M_imag_k = (double)in_XMM0_Qa;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&AC,&A);
  genRandom<std::complex<double>>();
  ALPHA._M_value._0_8_ = in_XMM0_Qa;
  ALPHA._M_value._8_8_ = in_XMM1_Qa;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  LDA = SUB84(in_XMM1_Qa,0);
  std::operator<<(local_1a8,"hblas2_ger ");
  std::operator<<(local_1a8,"u");
  std::operator<<(local_1a8,"_square_");
  std::operator<<(local_1a8,"C");
  ALPHA_00._M_value._8_8_ = 1;
  ALPHA_00._M_value._0_8_ =
       X.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  HAXX::HBLAS_GERU<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>>
            (100,100,ALPHA_00,
             Y.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,
             A.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100,in_XMM0_Qa,LDA);
  lVar6 = 0;
  lVar3 = 0;
  while (lVar3 != 100) {
    lVar13 = lVar3;
    for (lVar2 = 0; lVar2 != 0xc80; lVar2 = lVar2 + 0x20) {
      local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
      local_2a8 = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0xfc,&local_2c0);
      HAXX::operator*(&ALPHA,(quaternion<double> *)
                             ((long)&(X.
                                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar2));
      HAXX::operator*(&local_218,&local_1d8,
                      Y.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar3);
      pdVar1 = (double *)
               ((long)&(AC.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar2 + lVar6);
      __r._M_real = *pdVar1 + local_218._M_real;
      __r._M_imag_i = pdVar1[1] + local_218._M_imag_i;
      __r._M_imag_j = pdVar1[2] + local_218._M_imag_j;
      __r._M_imag_k = pdVar1[3] + local_218._M_imag_k;
      HAXX::inv<double>(&local_1f8,
                        (quaternion<double> *)
                        ((long)&(A.
                                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar2 + lVar6
                        ));
      HAXX::operator*(&local_258,&__r,&local_1f8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_258._M_imag_i;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_258._M_imag_j;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_258._M_imag_k;
      local_270 = 0;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (local_258._M_real + -1.0) * (local_258._M_real + -1.0);
      auVar9 = vfmadd231sd_fma(auVar12,auVar9,auVar9);
      auVar9 = vfmadd231sd_fma(auVar9,auVar10,auVar10);
      auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar11);
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      local_2f8[0] = auVar9._0_8_ < 1e-12;
      local_2f0 = 0;
      sStack_2e8.pi_ = (sp_counted_base *)0x0;
      local_2d0 = 
      "( HAXX::norm(((ALPHA*X[i]*Y[j] + AC[( (i) + (j)*(100) )]) * HAXX::inv(A[( (i) + (j)*(100) )]))- 1.) < 1e-12 )"
      ;
      local_2c8 = "";
      local_278 = &PTR__lazy_ostream_00219908;
      local_268 = &boost::unit_test::lazy_ostream::inst;
      local_260 = &local_2d0;
      local_2e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
      local_2d8 = "";
      boost::test_tools::tt_detail::report_assertion(local_2f8,&local_278,&local_2e0,0xfc,1,0,0);
      boost::detail::shared_count::~shared_count(&sStack_2e8);
    }
    lVar6 = lVar6 + 0xc80;
    lVar3 = lVar13 + 1;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&AC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&Y.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas2_ger_square() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN), A(HBLAS2_MATLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y)
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> AC(A);

  _AlphaF ALPHA = genRandom<_AlphaF>();

  std::stringstream ss;

  ss << "hblas2_ger ";
  if( _CONJ ) ss << "c";
  else        ss << "u";
  ss << "_square_";
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";

  if( _CONJ )
    HBLAS_GERC(HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&X[0],1,&Y[0],1,&A[0],HBLAS1_VECLEN);
  else
    HBLAS_GERU(HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&X[0],1,&Y[0],1,&A[0],HBLAS1_VECLEN);

  for(int j = 0; j < HBLAS1_VECLEN; j++) 
  for(int i = 0; i < HBLAS1_VECLEN; i++) {

    if( _CONJ )
      BOOST_CHECK(
        CMP_Q(
          ALPHA*X[i]*HAXX::conj(Y[j]) + AC[RANK2_INDX(i,j,HBLAS1_VECLEN)],
          A[RANK2_INDX(i,j,HBLAS1_VECLEN)]
        )
      );
    else
      BOOST_CHECK(
        CMP_Q(
          ALPHA*X[i]*Y[j] + AC[RANK2_INDX(i,j,HBLAS1_VECLEN)],
          A[RANK2_INDX(i,j,HBLAS1_VECLEN)]
        )
      );

  }
}